

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cc
# Opt level: O3

bool __thiscall
google::protobuf::json_internal::JsonWriter::MaybeWriteSpecialFp(JsonWriter *this,double val)

{
  size_t len;
  char *bytes;
  
  if (val < INFINITY) {
    if (-INFINITY < val) {
      if (!NAN(val)) {
        return false;
      }
      bytes = "\"NaN\"";
      len = 5;
    }
    else {
      bytes = "\"-Infinity\"";
      len = 0xb;
    }
  }
  else {
    bytes = "\"Infinity\"";
    len = 10;
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,bytes,len);
  return true;
}

Assistant:

bool JsonWriter::MaybeWriteSpecialFp(double val) {
  if (val == std::numeric_limits<double>::infinity()) {
    Write("\"Infinity\"");
  } else if (val == -std::numeric_limits<double>::infinity()) {
    Write("\"-Infinity\"");
  } else if (std::isnan(val)) {
    Write("\"NaN\"");
  } else {
    return false;
  }
  return true;
}